

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

int FreeEXRHeader(EXRHeader *exr_header)

{
  long lVar1;
  int iVar2;
  uchar **ppuVar3;
  
  if (exr_header == (EXRHeader *)0x0) {
    iVar2 = -3;
  }
  else {
    free(exr_header->channels);
    free(exr_header->pixel_types);
    free(exr_header->requested_pixel_types);
    ppuVar3 = &exr_header->custom_attributes[0].value;
    iVar2 = 0;
    for (lVar1 = 0; lVar1 < exr_header->num_custom_attributes; lVar1 = lVar1 + 1) {
      free(*ppuVar3);
      ppuVar3 = ppuVar3 + 0x42;
    }
  }
  return iVar2;
}

Assistant:

int FreeEXRHeader(EXRHeader *exr_header) {
  if (exr_header == NULL) {
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  if (exr_header->channels) {
    free(exr_header->channels);
  }

  if (exr_header->pixel_types) {
    free(exr_header->pixel_types);
  }

  if (exr_header->requested_pixel_types) {
    free(exr_header->requested_pixel_types);
  }

  for (int i = 0; i < exr_header->num_custom_attributes; i++) {
    if (exr_header->custom_attributes[i].value) {
      free(exr_header->custom_attributes[i].value);
    }
  }

  return TINYEXR_SUCCESS;
}